

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O2

LispPTR aref1(LispPTR array,int index)

{
  char cVar1;
  LispPTR *pLVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  pLVar2 = NativeAligned4FromLAddr(array);
  if ((int)pLVar2[2] <= index) {
    printf("Invalid index in GC\'s AREF1:  0x%x\n",index);
    printf(" Array size limit:  0x%x\n",(ulong)pLVar2[2]);
    printf(" Array ptr: 0x%x\n",array);
    printf(" Array 68K ptr: %p\n",pLVar2);
    printf("base:     0x%x\n",(ulong)(*pLVar2 & 0xfffffff));
    printf("offset:   0x%x\n",(ulong)(ushort)pLVar2[1]);
    printf("type #:   0x%x\n",(ulong)*(byte *)((long)pLVar2 + 6));
    printf("fill ptr: 0x%x\n",(ulong)pLVar2[3]);
    error("index out of range in GC\'s AREF1.");
  }
  lVar4 = (long)index + (ulong)(ushort)pLVar2[1];
  cVar1 = *(char *)((long)pLVar2 + 6);
  uVar5 = *pLVar2 & 0xfffffff;
  iVar3 = (int)lVar4;
  if (cVar1 == '&') {
    pLVar2 = NativeAligned4FromLAddr(uVar5);
    uVar5 = pLVar2[iVar3];
  }
  else {
    if (cVar1 == '\x04') {
      uVar5 = (uint)*(ushort *)((ulong)(Lisp_world + (ulong)uVar5 + (long)iVar3) ^ 2);
    }
    else {
      if (cVar1 != '\x03') {
        error("Not Implemented in gc\'s aref1 (other types)");
        return 0;
      }
      uVar5 = (uint)*(byte *)((long)Lisp_world + lVar4 + (ulong)uVar5 * 2 ^ 3);
    }
    uVar5 = uVar5 | 0xe0000;
  }
  return uVar5;
}

Assistant:

LispPTR aref1(LispPTR array, int index) {
  LispPTR retval = 0;
  LispPTR base;
  short typenumber;
  struct arrayheader *actarray;

  actarray = (struct arrayheader *)NativeAligned4FromLAddr(array);
  if (index >= actarray->totalsize) {
    printf("Invalid index in GC's AREF1:  0x%x\n", index);
    printf(" Array size limit:  0x%x\n", actarray->totalsize);
    printf(" Array ptr: 0x%x\n", array);
    printf(" Array 68K ptr: %p\n", (void *)actarray);
    printf("base:     0x%x\n", actarray->base);
    printf("offset:   0x%x\n", actarray->offset);
    printf("type #:   0x%x\n", actarray->typenumber);
    printf("fill ptr: 0x%x\n", actarray->fillpointer);
    error("index out of range in GC's AREF1.");
  }
  index += actarray->offset;
  typenumber = actarray->typenumber;
  base = actarray->base;
  switch (typenumber) {
    case 3: /* unsigned 8bits */
      retval = (GETBYTE(((char *)NativeAligned2FromLAddr(base)) + index)) & 0x0ff;
      retval |= S_POSITIVE;
      break;
    case 4: /* unsigned 16bits */
      retval = (GETWORD(((DLword *)NativeAligned2FromLAddr(base)) + index)) & 0x0ffff;
      retval |= S_POSITIVE;
      break;
    case 38: retval = (*(((LispPTR *)NativeAligned4FromLAddr(base)) + index)); break;
    default: error("Not Implemented in gc's aref1 (other types)");
  }
  return (retval);
}